

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNOT.cpp
# Opt level: O2

void test_qclab_qgates_CNOT<double>(void)

{
  int iVar1;
  int *qubits_00;
  bool bVar2;
  char cVar3;
  undefined4 uVar4;
  int iVar5;
  undefined4 uVar6;
  char *pcVar7;
  char *in_R9;
  AssertHelper local_258;
  AssertionResult gtest_ar__2;
  vector<int,_std::allocator<int>_> qubits;
  CNOT<double> cnot2;
  AssertionResult gtest_ar__7;
  SquareMatrix<double> CNOT_check;
  AssertHelper local_1e0;
  CNOT<double> cnot;
  PauliX<double> X;
  stringstream qasm;
  undefined7 uStack_1af;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1a8;
  ostream local_1a0 [376];
  int qnew [2];
  
  qclab::qgates::CX<double>::CX(&cnot);
  uVar6 = 2;
  gtest_ar__2._0_4_ = 2;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = uVar6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot.nbQubits()","2",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xd,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qasm = (stringstream)0x1;
  local_1a8._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qasm = (stringstream)0x1;
  local_1a8._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_4_ = cnot.super_QControlledGate2<double>.control_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot.control()","0",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x10,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  uVar4 = (**(code **)(*(long *)cnot.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<double>,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<double>_*,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                .super__Head_base<0UL,_qclab::qgates::PauliX<double>_*,_false>.
                                _M_head_impl + 0x18))();
  gtest_ar__2._0_4_ = uVar4;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot.target()","1",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x11,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_4_ = cnot.super_QControlledGate2<double>.controlState_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot.controlState()","1",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x12,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            (&CNOT_check,1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,1.0,0.0);
  qclab::qgates::QControlledGate2<double>::matrix((QControlledGate2<double> *)&qasm);
  bVar2 = qclab::dense::SquareMatrix<double>::operator==((SquareMatrix<double> *)&qasm,&CNOT_check);
  gtest_ar__2.success_ = bVar2;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&local_1a8);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&qubits);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&gtest_ar__2,
               (AssertionResult *)"cnot.matrix() == CNOT_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cnot2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x19,(char *)CONCAT71(uStack_1af,qasm));
    testing::internal::AssertHelper::operator=((AssertHelper *)&cnot2,(Message *)&qubits);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cnot2);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  iVar5 = (**(code **)(*(long *)cnot.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<double>,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<double>_*,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                .super__Head_base<0UL,_qclab::qgates::PauliX<double>_*,_false>.
                                _M_head_impl + 0x18))();
  iVar1 = cnot.super_QControlledGate2<double>.control_;
  if (iVar5 < cnot.super_QControlledGate2<double>.control_) {
    iVar1 = iVar5;
  }
  gtest_ar__2._0_4_ = iVar1;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot.qubit()","0",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x1c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qclab::qgates::QControlledGate2<double>::qubits(&qubits,&cnot.super_QControlledGate2<double>);
  gtest_ar__2._0_8_ =
       (long)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start._4_4_,
                qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start._0_4_) >> 2;
  cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>._vptr_QObject.
  _0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&qasm,"qubits.size()","2",(unsigned_long *)&gtest_ar__2,(int *)&cnot2);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cnot2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x20,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cnot2,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cnot2);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_8_ = gtest_ar__2._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"qubits[0]","0",
             (int *)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_),(int *)&gtest_ar__2);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cnot2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x21,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cnot2,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cnot2);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"qubits[1]","1",
             (int *)(CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + 4),(int *)&gtest_ar__2);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cnot2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x22,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cnot2,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cnot2);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qnew[0] = 5;
  qnew[1] = 3;
  qclab::qgates::QControlledGate2<double>::setQubits(&cnot.super_QControlledGate2<double>,qnew);
  qclab::qgates::QControlledGate2<double>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,&cnot.super_QControlledGate2<double>);
  cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>._vptr_QObject.
  _0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot.qubits()[0]","3",(int *)CONCAT71(uStack_1af,qasm),
             (int *)&cnot2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&qasm);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cnot2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x25,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cnot2,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cnot2);
    if ((long *)CONCAT71(uStack_1af,qasm) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_1af,qasm) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  qclab::qgates::QControlledGate2<double>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,&cnot.super_QControlledGate2<double>);
  cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>._vptr_QObject.
  _0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot.qubits()[1]","5",(int *)(CONCAT71(uStack_1af,qasm) + 4),
             (int *)&cnot2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&qasm);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cnot2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x26,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cnot2,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cnot2);
    if ((long *)CONCAT71(uStack_1af,qasm) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_1af,qasm) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  qnew[0] = 0;
  qnew[1] = 1;
  qclab::qgates::QControlledGate2<double>::setQubits(&cnot.super_QControlledGate2<double>,qnew);
  qclab::qgates::QGate2<double>::print((QGate2<double> *)&cnot);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>._vptr_QObject.
  _0_4_ = qclab::qgates::CX<double>::toQASM(&cnot,local_1a0,0);
  X.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)
       ((ulong)X.super_QGate1<double>.super_QObject<double>._vptr_QObject._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot.toQASM( qasm )","0",(int *)&cnot2,(int *)&X);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&cnot2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x30,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X,(Message *)&cnot2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X);
    if ((long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                         super_QObject<double>._vptr_QObject._4_4_,
                         (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                               super_QObject<double>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                                     super_QObject<double>._vptr_QObject._4_4_,
                                     (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>
                                           .super_QObject<double>._vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
            ((internal *)&cnot2,"qasm.str()","\"cx q[0], q[1];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar__2,
             (char (*) [16])"cx q[0], q[1];\n");
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  if ((char)cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>.
            _vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (cnot2.super_QControlledGate2<double>._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)cnot2.super_QControlledGate2<double>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x31,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cnot2.super_QControlledGate2<double>.control_);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&std::cout,(string *)&gtest_ar__2);
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  X.super_QGate1<double>.qubit_ = 0;
  X.super_QGate1<double>.super_QObject<double>._vptr_QObject = (_func_int **)&PTR_nbQubits_004cc1c0;
  cVar3 = (**(code **)(*(long *)cnot.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<double>,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<double>_*,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                .super__Head_base<0UL,_qclab::qgates::PauliX<double>_*,_false>.
                                _M_head_impl + 0x70))();
  cnot2.super_QControlledGate2<double>.control_ = 0;
  cnot2.super_QControlledGate2<double>.controlState_ = 0;
  cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>._vptr_QObject.
  _0_1_ = cVar3;
  if (cVar3 == '\0') {
    testing::Message::Message((Message *)&gtest_ar__7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&cnot2,(AssertionResult *)"*cnot.gate() == X",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x36,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cnot2.super_QControlledGate2<double>.control_);
  (**(code **)(*(long *)cnot.gate_._M_t.
                        super___uniq_ptr_impl<qclab::qgates::PauliX<double>,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_qclab::qgates::PauliX<double>_*,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                        .super__Head_base<0UL,_qclab::qgates::PauliX<double>_*,_false>._M_head_impl
              + 0x38))(&gtest_ar__2);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&gtest_ar__7);
  cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>._vptr_QObject.
  _0_1_ = qclab::dense::SquareMatrix<double>::operator==
                    ((SquareMatrix<double> *)&gtest_ar__2,(SquareMatrix<double> *)&gtest_ar__7);
  cnot2.super_QControlledGate2<double>.control_ = 0;
  cnot2.super_QControlledGate2<double>.controlState_ = 0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar__7.message_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar__2.message_);
  if ((char)cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>.
            _vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar__7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&cnot2,
               (AssertionResult *)"cnot.gate()->matrix() == X.matrix()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x37,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cnot2.super_QControlledGate2<double>.control_);
  cVar3 = (**(code **)((long)cnot.super_QControlledGate2<double>.super_QGate2<double>.
                             super_QObject<double>._vptr_QObject + 0x70))(&cnot,&X);
  cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>._vptr_QObject.
  _0_4_ = CONCAT31(cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>.
                   _vptr_QObject._1_3_,cVar3) ^ 1;
  cnot2.super_QControlledGate2<double>.control_ = 0;
  cnot2.super_QControlledGate2<double>.controlState_ = 0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&gtest_ar__7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&cnot2,(AssertionResult *)"cnot != X","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3a,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cnot2.super_QControlledGate2<double>.control_);
  cVar3 = (**(code **)((long)cnot.super_QControlledGate2<double>.super_QGate2<double>.
                             super_QObject<double>._vptr_QObject + 0x70))(&cnot,&X);
  cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>._vptr_QObject.
  _0_4_ = CONCAT31(cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>.
                   _vptr_QObject._1_3_,cVar3) ^ 1;
  cnot2.super_QControlledGate2<double>.control_ = 0;
  cnot2.super_QControlledGate2<double>.controlState_ = 0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&gtest_ar__7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&cnot2,(AssertionResult *)"cnot == X","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3b,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cnot2.super_QControlledGate2<double>.control_);
  qclab::qgates::CX<double>::CX(&cnot2);
  cVar3 = (**(code **)((long)cnot.super_QControlledGate2<double>.super_QGate2<double>.
                             super_QObject<double>._vptr_QObject + 0x70))(&cnot,&cnot2);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__7.success_ = (bool)cVar3;
  if (cVar3 == '\0') {
    testing::Message::Message((Message *)&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__7,(AssertionResult *)"cnot == cnot2",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3d,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=(&local_1e0,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  gtest_ar__7.success_ =
       (bool)(**(code **)((long)cnot.super_QControlledGate2<double>.super_QGate2<double>.
                                super_QObject<double>._vptr_QObject + 0x70))(&cnot,&cnot2);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar__7.success_ == false) {
    testing::Message::Message((Message *)&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__7,(AssertionResult *)"cnot != cnot2",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3e,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=(&local_1e0,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  qclab::qgates::QControlledGate2<double>::setControl(&cnot.super_QControlledGate2<double>,3);
  gtest_ar__7._0_4_ = cnot.super_QControlledGate2<double>.control_;
  local_258.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot.control()","3",(int *)&gtest_ar__7,(int *)&local_258);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__7);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x42,pcVar7);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if ((long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  qclab::qgates::CX<double>::setTarget(&cnot,5);
  gtest_ar__7._0_4_ =
       (**(code **)(*(long *)cnot.gate_._M_t.
                             super___uniq_ptr_impl<qclab::qgates::PauliX<double>,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_qclab::qgates::PauliX<double>_*,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                             .super__Head_base<0UL,_qclab::qgates::PauliX<double>_*,_false>.
                             _M_head_impl + 0x18))();
  local_258.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot.target()","5",(int *)&gtest_ar__7,(int *)&local_258);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__7);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x44,pcVar7);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if ((long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  cVar3 = (**(code **)((long)cnot.super_QControlledGate2<double>.super_QGate2<double>.
                             super_QObject<double>._vptr_QObject + 0x70))(&cnot,&cnot2);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__7.success_ = (bool)cVar3;
  if (cVar3 == '\0') {
    testing::Message::Message((Message *)&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__7,(AssertionResult *)"cnot == cnot2",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x45,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=(&local_1e0,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  gtest_ar__7.success_ =
       (bool)(**(code **)((long)cnot.super_QControlledGate2<double>.super_QGate2<double>.
                                super_QObject<double>._vptr_QObject + 0x70))(&cnot,&cnot2);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar__7.success_ == false) {
    testing::Message::Message((Message *)&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__7,(AssertionResult *)"cnot != cnot2",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x46,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=(&local_1e0,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  qclab::qgates::QControlledGate2<double>::setControl(&cnot.super_QControlledGate2<double>,4);
  gtest_ar__7._0_4_ = cnot.super_QControlledGate2<double>.control_;
  local_258.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot.control()","4",(int *)&gtest_ar__7,(int *)&local_258);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__7);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x49,pcVar7);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if ((long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  qclab::qgates::CX<double>::setTarget(&cnot,1);
  gtest_ar__7._0_4_ =
       (**(code **)(*(long *)cnot.gate_._M_t.
                             super___uniq_ptr_impl<qclab::qgates::PauliX<double>,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_qclab::qgates::PauliX<double>_*,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                             .super__Head_base<0UL,_qclab::qgates::PauliX<double>_*,_false>.
                             _M_head_impl + 0x18))();
  local_258.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot.target()","1",(int *)&gtest_ar__7,(int *)&local_258);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__7);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x4b,pcVar7);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if ((long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  cVar3 = (**(code **)((long)cnot.super_QControlledGate2<double>.super_QGate2<double>.
                             super_QObject<double>._vptr_QObject + 0x70))(&cnot,&cnot2);
  gtest_ar__7._0_4_ = CONCAT31(gtest_ar__7._1_3_,cVar3) ^ 1;
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__7,(AssertionResult *)"cnot != cnot2",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x4c,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=(&local_1e0,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  cVar3 = (**(code **)((long)cnot.super_QControlledGate2<double>.super_QGate2<double>.
                             super_QObject<double>._vptr_QObject + 0x70))(&cnot,&cnot2);
  gtest_ar__7._0_4_ = CONCAT31(gtest_ar__7._1_3_,cVar3) ^ 1;
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__7,(AssertionResult *)"cnot == cnot2",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x4d,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=(&local_1e0,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  qubits_00 = (int *)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
  qubits_00[0] = 1;
  qubits_00[1] = 2;
  qclab::qgates::QControlledGate2<double>::setQubits(&cnot.super_QControlledGate2<double>,qubits_00)
  ;
  gtest_ar__7._0_4_ = cnot.super_QControlledGate2<double>.control_;
  local_258.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot.control()","1",(int *)&gtest_ar__7,(int *)&local_258);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__7);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x52,pcVar7);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if ((long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  gtest_ar__7._0_4_ =
       (**(code **)(*(long *)cnot.gate_._M_t.
                             super___uniq_ptr_impl<qclab::qgates::PauliX<double>,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_qclab::qgates::PauliX<double>_*,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                             .super__Head_base<0UL,_qclab::qgates::PauliX<double>_*,_false>.
                             _M_head_impl + 0x18))();
  local_258.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot.target()","2",(int *)&gtest_ar__7,(int *)&local_258);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__7);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x53,pcVar7);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if ((long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  cVar3 = (**(code **)((long)cnot.super_QControlledGate2<double>.super_QGate2<double>.
                             super_QObject<double>._vptr_QObject + 0x70))(&cnot,&cnot2);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__7.success_ = (bool)cVar3;
  if (cVar3 == '\0') {
    testing::Message::Message((Message *)&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__7,(AssertionResult *)"cnot == cnot2",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x54,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=(&local_1e0,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  gtest_ar__7.success_ =
       (bool)(**(code **)((long)cnot.super_QControlledGate2<double>.super_QGate2<double>.
                                super_QObject<double>._vptr_QObject + 0x70))();
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar__7.success_ == false) {
    testing::Message::Message((Message *)&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__7,(AssertionResult *)"cnot != cnot2",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x55,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=(&local_1e0,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  qclab::qgates::QControlledGate2<double>::setControl(&cnot.super_QControlledGate2<double>,0);
  gtest_ar__7._0_4_ = cnot.super_QControlledGate2<double>.control_;
  local_258.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot.control()","0",(int *)&gtest_ar__7,(int *)&local_258);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__7);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x58,pcVar7);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if ((long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  qclab::qgates::CX<double>::setTarget(&cnot,1);
  gtest_ar__7._0_4_ =
       (**(code **)(*(long *)cnot.gate_._M_t.
                             super___uniq_ptr_impl<qclab::qgates::PauliX<double>,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_qclab::qgates::PauliX<double>_*,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                             .super__Head_base<0UL,_qclab::qgates::PauliX<double>_*,_false>.
                             _M_head_impl + 0x18))();
  local_258.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot.target()","1",(int *)&gtest_ar__7,(int *)&local_258);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__7);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x5a,pcVar7);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if ((long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  cnot.super_QControlledGate2<double>.controlState_ = 0;
  gtest_ar__7.success_ = false;
  gtest_ar__7._1_3_ = 0;
  local_258.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot.controlState()","0",(int *)&gtest_ar__7,
             (int *)&local_258);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__7);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x5c,pcVar7);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if ((long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__7._4_4_,gtest_ar__7._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  cVar3 = (**(code **)((long)cnot.super_QControlledGate2<double>.super_QGate2<double>.
                             super_QObject<double>._vptr_QObject + 0x70))(&cnot,&cnot2);
  gtest_ar__7._0_4_ = CONCAT31(gtest_ar__7._1_3_,cVar3) ^ 1;
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__7,(AssertionResult *)"cnot != cnot2",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x5d,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=(&local_1e0,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  cVar3 = (**(code **)((long)cnot.super_QControlledGate2<double>.super_QGate2<double>.
                             super_QObject<double>._vptr_QObject + 0x70))();
  gtest_ar__7._0_4_ = CONCAT31(gtest_ar__7._1_3_,cVar3) ^ 1;
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2,(internal *)&gtest_ar__7,(AssertionResult *)"cnot == cnot2",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x5e,(char *)gtest_ar__2._0_8_);
    testing::internal::AssertHelper::operator=(&local_1e0,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar__2);
    if ((long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  qclab::qgates::CX<double>::~CX(&cnot2);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&qubits.super__Vector_base<int,_std::allocator<int>_>);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&CNOT_check.data_);
  qclab::qgates::CX<double>::~CX(&cnot);
  qclab::qgates::CX<double>::CX(&cnot,0,1,1);
  gtest_ar__2._0_4_ = 2;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = uVar6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot01.nbQubits()","2",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,100,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qasm = (stringstream)0x1;
  local_1a8._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qasm = (stringstream)0x1;
  local_1a8._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_4_ = cnot.super_QControlledGate2<double>.control_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot01.control()","0",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x67,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  uVar4 = (**(code **)(*(long *)cnot.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<double>,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<double>_*,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                .super__Head_base<0UL,_qclab::qgates::PauliX<double>_*,_false>.
                                _M_head_impl + 0x18))();
  gtest_ar__2._0_4_ = uVar4;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot01.target()","1",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x68,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_4_ = cnot.super_QControlledGate2<double>.controlState_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot01.controlState()","1",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x69,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&qubits,1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0
             ,1.0,0.0);
  qclab::qgates::QControlledGate2<double>::matrix((QControlledGate2<double> *)&qasm);
  bVar2 = qclab::dense::SquareMatrix<double>::operator==
                    ((SquareMatrix<double> *)&qasm,(SquareMatrix<double> *)&qubits);
  gtest_ar__2.success_ = bVar2;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&local_1a8);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&cnot2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&gtest_ar__2,
               (AssertionResult *)"cnot01.matrix() == CNOT_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x70,(char *)CONCAT71(uStack_1af,qasm));
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&cnot2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                         super_QObject<double>._vptr_QObject._4_4_,
                         (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                               super_QObject<double>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                                     super_QObject<double>._vptr_QObject._4_4_,
                                     (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>
                                           .super_QObject<double>._vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>._vptr_QObject.
  _0_4_ = qclab::qgates::CX<double>::toQASM(&cnot,local_1a0,0);
  CNOT_check.size_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot01.toQASM( qasm )","0",(int *)&cnot2,(int *)&CNOT_check);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&cnot2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x74,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&cnot2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    if ((long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                         super_QObject<double>._vptr_QObject._4_4_,
                         (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                               super_QObject<double>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                                     super_QObject<double>._vptr_QObject._4_4_,
                                     (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>
                                           .super_QObject<double>._vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
            ((internal *)&cnot2,"qasm.str()","\"cx q[0], q[1];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar__2,
             (char (*) [16])"cx q[0], q[1];\n");
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  if ((char)cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>.
            _vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (cnot2.super_QControlledGate2<double>._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)cnot2.super_QControlledGate2<double>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x75,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cnot2.super_QControlledGate2<double>.control_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish);
  qclab::qgates::CX<double>::~CX(&cnot);
  qclab::qgates::CX<double>::CX(&cnot,3,5,1);
  gtest_ar__2._0_4_ = 2;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = uVar6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot35.nbQubits()","2",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x7b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qasm = (stringstream)0x1;
  local_1a8._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qasm = (stringstream)0x1;
  local_1a8._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_4_ = cnot.super_QControlledGate2<double>.control_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot35.control()","3",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x7e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  uVar4 = (**(code **)(*(long *)cnot.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<double>,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<double>_*,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                .super__Head_base<0UL,_qclab::qgates::PauliX<double>_*,_false>.
                                _M_head_impl + 0x18))();
  gtest_ar__2._0_4_ = uVar4;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot35.target()","5",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x7f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_4_ = cnot.super_QControlledGate2<double>.controlState_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot35.controlState()","1",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x80,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&qubits,1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0
             ,1.0,0.0);
  qclab::qgates::QControlledGate2<double>::matrix((QControlledGate2<double> *)&qasm);
  bVar2 = qclab::dense::SquareMatrix<double>::operator==
                    ((SquareMatrix<double> *)&qasm,(SquareMatrix<double> *)&qubits);
  gtest_ar__2.success_ = bVar2;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&local_1a8);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&cnot2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&gtest_ar__2,
               (AssertionResult *)"cnot35.matrix() == CNOT_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x87,(char *)CONCAT71(uStack_1af,qasm));
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&cnot2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                         super_QObject<double>._vptr_QObject._4_4_,
                         (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                               super_QObject<double>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                                     super_QObject<double>._vptr_QObject._4_4_,
                                     (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>
                                           .super_QObject<double>._vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>._vptr_QObject.
  _0_4_ = qclab::qgates::CX<double>::toQASM(&cnot,local_1a0,0);
  CNOT_check.size_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot35.toQASM( qasm )","0",(int *)&cnot2,(int *)&CNOT_check);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&cnot2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x8b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&cnot2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    if ((long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                         super_QObject<double>._vptr_QObject._4_4_,
                         (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                               super_QObject<double>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                                     super_QObject<double>._vptr_QObject._4_4_,
                                     (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>
                                           .super_QObject<double>._vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
            ((internal *)&cnot2,"qasm.str()","\"cx q[3], q[5];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar__2,
             (char (*) [16])"cx q[3], q[5];\n");
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  if ((char)cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>.
            _vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (cnot2.super_QControlledGate2<double>._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)cnot2.super_QControlledGate2<double>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x8c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cnot2.super_QControlledGate2<double>.control_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish);
  qclab::qgates::CX<double>::~CX(&cnot);
  qclab::qgates::CX<double>::CX(&cnot,1,0,1);
  gtest_ar__2._0_4_ = 2;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = uVar6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot10.nbQubits()","2",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x92,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qasm = (stringstream)0x1;
  local_1a8._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qasm = (stringstream)0x1;
  local_1a8._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_4_ = cnot.super_QControlledGate2<double>.control_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot10.control()","1",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x95,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  uVar4 = (**(code **)(*(long *)cnot.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<double>,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<double>_*,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                .super__Head_base<0UL,_qclab::qgates::PauliX<double>_*,_false>.
                                _M_head_impl + 0x18))();
  gtest_ar__2._0_4_ = uVar4;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot10.target()","0",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x96,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_4_ = cnot.super_QControlledGate2<double>.controlState_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot10.controlState()","1",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x97,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&qubits,1.0,0.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,1.0,0.0,0.0,1.0
             ,0.0,0.0);
  qclab::qgates::QControlledGate2<double>::matrix((QControlledGate2<double> *)&qasm);
  bVar2 = qclab::dense::SquareMatrix<double>::operator==
                    ((SquareMatrix<double> *)&qasm,(SquareMatrix<double> *)&qubits);
  gtest_ar__2.success_ = bVar2;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&local_1a8);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&cnot2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&gtest_ar__2,
               (AssertionResult *)"cnot10.matrix() == CNOT_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x9e,(char *)CONCAT71(uStack_1af,qasm));
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&cnot2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                         super_QObject<double>._vptr_QObject._4_4_,
                         (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                               super_QObject<double>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                                     super_QObject<double>._vptr_QObject._4_4_,
                                     (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>
                                           .super_QObject<double>._vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>._vptr_QObject.
  _0_4_ = qclab::qgates::CX<double>::toQASM(&cnot,local_1a0,0);
  CNOT_check.size_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot10.toQASM( qasm )","0",(int *)&cnot2,(int *)&CNOT_check);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&cnot2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xa2,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&cnot2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    if ((long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                         super_QObject<double>._vptr_QObject._4_4_,
                         (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                               super_QObject<double>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                                     super_QObject<double>._vptr_QObject._4_4_,
                                     (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>
                                           .super_QObject<double>._vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
            ((internal *)&cnot2,"qasm.str()","\"cx q[1], q[0];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar__2,
             (char (*) [16])"cx q[1], q[0];\n");
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  if ((char)cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>.
            _vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (cnot2.super_QControlledGate2<double>._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)cnot2.super_QControlledGate2<double>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xa3,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cnot2.super_QControlledGate2<double>.control_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish);
  qclab::qgates::CX<double>::~CX(&cnot);
  qclab::qgates::CX<double>::CX(&cnot,5,3,1);
  gtest_ar__2._0_4_ = 2;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = uVar6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot53.nbQubits()","2",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xa9,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qasm = (stringstream)0x1;
  local_1a8._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qasm = (stringstream)0x1;
  local_1a8._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_4_ = cnot.super_QControlledGate2<double>.control_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot53.control()","5",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xac,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  uVar4 = (**(code **)(*(long *)cnot.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<double>,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<double>_*,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                .super__Head_base<0UL,_qclab::qgates::PauliX<double>_*,_false>.
                                _M_head_impl + 0x18))();
  gtest_ar__2._0_4_ = uVar4;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot53.target()","3",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xad,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_4_ = cnot.super_QControlledGate2<double>.controlState_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot53.controlState()","1",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xae,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&qubits,1.0,0.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,1.0,0.0,0.0,1.0
             ,0.0,0.0);
  qclab::qgates::QControlledGate2<double>::matrix((QControlledGate2<double> *)&qasm);
  bVar2 = qclab::dense::SquareMatrix<double>::operator==
                    ((SquareMatrix<double> *)&qasm,(SquareMatrix<double> *)&qubits);
  gtest_ar__2.success_ = bVar2;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&local_1a8);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&cnot2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&gtest_ar__2,
               (AssertionResult *)"cnot53.matrix() == CNOT_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xb5,(char *)CONCAT71(uStack_1af,qasm));
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&cnot2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                         super_QObject<double>._vptr_QObject._4_4_,
                         (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                               super_QObject<double>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                                     super_QObject<double>._vptr_QObject._4_4_,
                                     (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>
                                           .super_QObject<double>._vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>._vptr_QObject.
  _0_4_ = qclab::qgates::CX<double>::toQASM(&cnot,local_1a0,0);
  CNOT_check.size_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot53.toQASM( qasm )","0",(int *)&cnot2,(int *)&CNOT_check);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&cnot2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xb9,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&cnot2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    if ((long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                         super_QObject<double>._vptr_QObject._4_4_,
                         (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                               super_QObject<double>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                                     super_QObject<double>._vptr_QObject._4_4_,
                                     (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>
                                           .super_QObject<double>._vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
            ((internal *)&cnot2,"qasm.str()","\"cx q[5], q[3];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar__2,
             (char (*) [16])"cx q[5], q[3];\n");
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  if ((char)cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>.
            _vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (cnot2.super_QControlledGate2<double>._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)cnot2.super_QControlledGate2<double>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xba,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cnot2.super_QControlledGate2<double>.control_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish);
  qclab::qgates::CX<double>::~CX(&cnot);
  qclab::qgates::CX<double>::CX(&cnot,0,1,0);
  gtest_ar__2._0_4_ = 2;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = uVar6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot01.nbQubits()","2",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xc4,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qasm = (stringstream)0x1;
  local_1a8._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qasm = (stringstream)0x1;
  local_1a8._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_4_ = cnot.super_QControlledGate2<double>.control_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot01.control()","0",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,199,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  uVar4 = (**(code **)(*(long *)cnot.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<double>,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<double>_*,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                .super__Head_base<0UL,_qclab::qgates::PauliX<double>_*,_false>.
                                _M_head_impl + 0x18))();
  gtest_ar__2._0_4_ = uVar4;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot01.target()","1",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,200,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_4_ = cnot.super_QControlledGate2<double>.controlState_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot01.controlState()","0",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xc9,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&qubits,0.0,1.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0
             ,0.0,1.0);
  qclab::qgates::QControlledGate2<double>::matrix((QControlledGate2<double> *)&qasm);
  bVar2 = qclab::dense::SquareMatrix<double>::operator==
                    ((SquareMatrix<double> *)&qasm,(SquareMatrix<double> *)&qubits);
  gtest_ar__2.success_ = bVar2;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&local_1a8);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&cnot2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&gtest_ar__2,
               (AssertionResult *)"cnot01.matrix() == CNOT_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xd0,(char *)CONCAT71(uStack_1af,qasm));
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&cnot2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                         super_QObject<double>._vptr_QObject._4_4_,
                         (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                               super_QObject<double>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                                     super_QObject<double>._vptr_QObject._4_4_,
                                     (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>
                                           .super_QObject<double>._vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>._vptr_QObject.
  _0_4_ = qclab::qgates::CX<double>::toQASM(&cnot,local_1a0,0);
  CNOT_check.size_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot01.toQASM( qasm )","0",(int *)&cnot2,(int *)&CNOT_check);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&cnot2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xd4,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&cnot2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    if ((long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                         super_QObject<double>._vptr_QObject._4_4_,
                         (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                               super_QObject<double>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                                     super_QObject<double>._vptr_QObject._4_4_,
                                     (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>
                                           .super_QObject<double>._vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[32]>
            ((internal *)&cnot2,"qasm.str()","\"x q[0];\\ncx q[0], q[1];\\nx q[0];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar__2,
             (char (*) [32])"x q[0];\ncx q[0], q[1];\nx q[0];\n");
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  if ((char)cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>.
            _vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (cnot2.super_QControlledGate2<double>._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)cnot2.super_QControlledGate2<double>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xd5,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cnot2.super_QControlledGate2<double>.control_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish);
  qclab::qgates::CX<double>::~CX(&cnot);
  qclab::qgates::CX<double>::CX(&cnot,1,0,0);
  gtest_ar__2._0_4_ = 2;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = uVar6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot10.nbQubits()","2",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xdb,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qasm = (stringstream)0x1;
  local_1a8._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qasm = (stringstream)0x1;
  local_1a8._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_4_ = cnot.super_QControlledGate2<double>.control_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot10.control()","1",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xde,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  uVar6 = (**(code **)(*(long *)cnot.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<double>,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<double>_*,_std::default_delete<qclab::qgates::PauliX<double>_>_>
                                .super__Head_base<0UL,_qclab::qgates::PauliX<double>_*,_false>.
                                _M_head_impl + 0x18))();
  gtest_ar__2._0_4_ = uVar6;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot10.target()","0",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xdf,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  gtest_ar__2._0_4_ = cnot.super_QControlledGate2<double>.controlState_;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"cnot10.controlState()","0",(int *)&gtest_ar__2,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (local_1a8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xe0,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&qubits,0.0,0.0,1.0,0.0,0.0,1.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,0.0
             ,0.0,1.0);
  qclab::qgates::QControlledGate2<double>::matrix((QControlledGate2<double> *)&qasm);
  bVar2 = qclab::dense::SquareMatrix<double>::operator==
                    ((SquareMatrix<double> *)&qasm,(SquareMatrix<double> *)&qubits);
  gtest_ar__2.success_ = bVar2;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&local_1a8);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&cnot2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&gtest_ar__2,
               (AssertionResult *)"cnot10.matrix() == CNOT_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xe7,(char *)CONCAT71(uStack_1af,qasm));
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&cnot2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                         super_QObject<double>._vptr_QObject._4_4_,
                         (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                               super_QObject<double>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                                     super_QObject<double>._vptr_QObject._4_4_,
                                     (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>
                                           .super_QObject<double>._vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>._vptr_QObject.
  _0_4_ = qclab::qgates::CX<double>::toQASM(&cnot,local_1a0,0);
  CNOT_check.size_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"cnot10.toQASM( qasm )","0",(int *)&cnot2,(int *)&CNOT_check);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&cnot2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xeb,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&cnot2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    if ((long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                         super_QObject<double>._vptr_QObject._4_4_,
                         (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                               super_QObject<double>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(cnot2.super_QControlledGate2<double>.super_QGate2<double>.
                                     super_QObject<double>._vptr_QObject._4_4_,
                                     (uint)cnot2.super_QControlledGate2<double>.super_QGate2<double>
                                           .super_QObject<double>._vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[32]>
            ((internal *)&cnot2,"qasm.str()","\"x q[1];\\ncx q[1], q[0];\\nx q[1];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar__2,
             (char (*) [32])"x q[1];\ncx q[1], q[0];\nx q[1];\n");
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  if ((char)cnot2.super_QControlledGate2<double>.super_QGate2<double>.super_QObject<double>.
            _vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (cnot2.super_QControlledGate2<double>._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)cnot2.super_QControlledGate2<double>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&CNOT_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xec,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&CNOT_check,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&CNOT_check);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cnot2.super_QControlledGate2<double>.control_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish);
  qclab::qgates::CX<double>::~CX(&cnot);
  return;
}

Assistant:

void test_qclab_qgates_CNOT() {

  //
  // CNOTs |1> controlled
  //
  {
    qclab::qgates::CNOT< T >  cnot ;

    EXPECT_EQ( cnot.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot.controlled() ) ;      // controlled
    EXPECT_EQ( cnot.control() , 0 ) ;       // control
    EXPECT_EQ( cnot.target() , 1 ) ;        // target
    EXPECT_EQ( cnot.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ) ;
    EXPECT_TRUE( cnot.matrix() == CNOT_check ) ;

    // qubit
    EXPECT_EQ( cnot.qubit() , 0 ) ;

    // qubits
    auto qubits = cnot.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 5 , 3 } ;
    cnot.setQubits( &qnew[0] ) ;
    EXPECT_EQ( cnot.qubits()[0] , 3 ) ;
    EXPECT_EQ( cnot.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    cnot.setQubits( &qnew[0] ) ;

    // print
    cnot.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // gate
    qclab::qgates::PauliX< T >  X ;
    EXPECT_TRUE( *cnot.gate() == X ) ;
    EXPECT_TRUE( cnot.gate()->matrix() == X.matrix() ) ;

    // operators == and !=
    EXPECT_TRUE(  cnot != X ) ;
    EXPECT_FALSE( cnot == X ) ;
    qclab::qgates::CNOT< T >  cnot2 ;
    EXPECT_TRUE(  cnot == cnot2 ) ;
    EXPECT_FALSE( cnot != cnot2 ) ;

    // setControl, setTarget, setControlState
    cnot.setControl( 3 ) ;
    EXPECT_EQ( cnot.control() , 3 ) ;
    cnot.setTarget( 5 ) ;
    EXPECT_EQ( cnot.target() , 5 ) ;
    EXPECT_TRUE(  cnot == cnot2 ) ;
    EXPECT_FALSE( cnot != cnot2 ) ;

    cnot.setControl( 4 ) ;
    EXPECT_EQ( cnot.control() , 4 ) ;
    cnot.setTarget( 1 ) ;
    EXPECT_EQ( cnot.target() , 1 ) ;
    EXPECT_TRUE(  cnot != cnot2 ) ;
    EXPECT_FALSE( cnot == cnot2 ) ;

    qubits[0] = 1 ;
    qubits[1] = 2 ;
    cnot.setQubits( &qubits[0] ) ;
    EXPECT_EQ( cnot.control() , 1 ) ;
    EXPECT_EQ( cnot.target() , 2 ) ;
    EXPECT_TRUE(  cnot == cnot2 ) ;
    EXPECT_FALSE( cnot != cnot2 ) ;

    cnot.setControl( 0 ) ;
    EXPECT_EQ( cnot.control() , 0 ) ;
    cnot.setTarget( 1 ) ;
    EXPECT_EQ( cnot.target() , 1 ) ;
    cnot.setControlState( 0 ) ;
    EXPECT_EQ( cnot.controlState() , 0 ) ;
    EXPECT_TRUE(  cnot != cnot2 ) ;
    EXPECT_FALSE( cnot == cnot2 ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot01( 0 , 1 ) ;

    EXPECT_EQ( cnot01.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot01.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot01.controlled() ) ;      // controlled
    EXPECT_EQ( cnot01.control() , 0 ) ;       // control
    EXPECT_EQ( cnot01.target() , 1 ) ;        // target
    EXPECT_EQ( cnot01.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ) ;
    EXPECT_TRUE( cnot01.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot01.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[0], q[1];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot35( 3 , 5 ) ;

    EXPECT_EQ( cnot35.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot35.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot35.controlled() ) ;      // controlled
    EXPECT_EQ( cnot35.control() , 3 ) ;       // control
    EXPECT_EQ( cnot35.target() , 5 ) ;        // target
    EXPECT_EQ( cnot35.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ) ;
    EXPECT_TRUE( cnot35.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot35.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[3], q[5];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot10( 1 , 0 ) ;

    EXPECT_EQ( cnot10.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot10.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot10.controlled() ) ;      // controlled
    EXPECT_EQ( cnot10.control() , 1 ) ;       // control
    EXPECT_EQ( cnot10.target() , 0 ) ;        // target
    EXPECT_EQ( cnot10.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ) ;
    EXPECT_TRUE( cnot10.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot10.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[1], q[0];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot53( 5 , 3 ) ;

    EXPECT_EQ( cnot53.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot53.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot53.controlled() ) ;      // controlled
    EXPECT_EQ( cnot53.control() , 5 ) ;       // control
    EXPECT_EQ( cnot53.target() , 3 ) ;        // target
    EXPECT_EQ( cnot53.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ) ;
    EXPECT_TRUE( cnot53.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot53.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[5], q[3];\n" ) ;
  }


  //
  // CNOTs |0> controlled
  //
  {
    qclab::qgates::CNOT< T >  cnot01( 0 , 1 , 0 ) ;

    EXPECT_EQ( cnot01.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot01.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot01.controlled() ) ;      // controlled
    EXPECT_EQ( cnot01.control() , 0 ) ;       // control
    EXPECT_EQ( cnot01.target() , 1 ) ;        // target
    EXPECT_EQ( cnot01.controlState() , 0 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 0 , 1 , 0 , 0 ,
                                                 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( cnot01.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot01.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[0];\ncx q[0], q[1];\nx q[0];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot10( 1 , 0 , 0 ) ;

    EXPECT_EQ( cnot10.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot10.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot10.controlled() ) ;      // controlled
    EXPECT_EQ( cnot10.control() , 1 ) ;       // control
    EXPECT_EQ( cnot10.target() , 0 ) ;        // target
    EXPECT_EQ( cnot10.controlState() , 0 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( cnot10.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot10.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[1];\ncx q[1], q[0];\nx q[1];\n" ) ;
  }

}